

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

void nghttp2_frame_headers_init
               (nghttp2_headers *frame,uint8_t flags,int32_t stream_id,nghttp2_headers_category cat,
               nghttp2_priority_spec *pri_spec,nghttp2_nv *nva,size_t nvlen)

{
  undefined3 uVar1;
  int32_t iVar2;
  nghttp2_priority_spec *pnVar3;
  
  (frame->hd).length = 0;
  (frame->hd).type = '\x01';
  (frame->hd).flags = flags;
  (frame->hd).stream_id = stream_id;
  (frame->hd).reserved = '\0';
  frame->padlen = 0;
  frame->nva = nva;
  frame->nvlen = nvlen;
  frame->cat = cat;
  pnVar3 = &frame->pri_spec;
  if (pri_spec != (nghttp2_priority_spec *)0x0) {
    uVar1 = *(undefined3 *)&pri_spec->field_0x9;
    (frame->pri_spec).exclusive = pri_spec->exclusive;
    *(undefined3 *)&(frame->pri_spec).field_0x9 = uVar1;
    iVar2 = pri_spec->weight;
    pnVar3->stream_id = pri_spec->stream_id;
    pnVar3->weight = iVar2;
    return;
  }
  pnVar3->stream_id = 0;
  pnVar3->weight = 0x10;
  (frame->pri_spec).exclusive = '\0';
  return;
}

Assistant:

void nghttp2_frame_headers_init(nghttp2_headers *frame, uint8_t flags,
                                int32_t stream_id, nghttp2_headers_category cat,
                                const nghttp2_priority_spec *pri_spec,
                                nghttp2_nv *nva, size_t nvlen) {
  nghttp2_frame_hd_init(&frame->hd, 0, NGHTTP2_HEADERS, flags, stream_id);
  frame->padlen = 0;
  frame->nva = nva;
  frame->nvlen = nvlen;
  frame->cat = cat;

  if (pri_spec) {
    frame->pri_spec = *pri_spec;
  } else {
    nghttp2_priority_spec_default_init(&frame->pri_spec);
  }
}